

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O0

void __thiscall pg::PPSolver::run(PPSolver *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  int *piVar14;
  vector<int,_std::allocator<int>_> *this_00;
  ostream *poVar15;
  vector<int,_std::allocator<int>_> *pvVar16;
  ulong uVar17;
  int local_64;
  vector<int,_std::allocator<int>_> *local_48;
  uint local_20;
  int res;
  int p;
  int i;
  int i_2;
  int i_1;
  PPSolver *this_local;
  
  lVar10 = Solver::nodecount(&this->super_Solver);
  iVar8 = Solver::priority(&this->super_Solver,(int)lVar10 + -1);
  this->max_prio = iVar8;
  uVar11 = (ulong)(this->max_prio + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  uVar12 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar17 = uVar12 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar12) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar13 = (ulong *)operator_new__(uVar17);
  *puVar13 = uVar11;
  pvVar16 = (vector<int,_std::allocator<int>_> *)(puVar13 + 1);
  if (uVar11 != 0) {
    local_48 = pvVar16;
    do {
      std::vector<int,_std::allocator<int>_>::vector(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pvVar16 + uVar11);
  }
  this->regions = pvVar16;
  uVar11 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  uVar11 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  this->region = piVar14;
  uVar11 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  uVar11 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  this->strategy = piVar14;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(this->max_prio + 1);
  uVar11 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  this->inverse = piVar14;
  for (i = 0; lVar10 = Solver::nodecount(&this->super_Solver), i < lVar10; i = i + 1) {
    bVar6 = bitset::operator[]((this->super_Solver).disabled,(long)i);
    if (bVar6) {
      local_64 = -2;
    }
    else {
      local_64 = Solver::priority(&this->super_Solver,i);
    }
    this->region[i] = local_64;
  }
  for (p = 0; lVar10 = Solver::nodecount(&this->super_Solver), p < lVar10; p = p + 1) {
    this->strategy[p] = -1;
  }
  lVar10 = Solver::nodecount(&this->super_Solver);
  res = (int)lVar10 + -1;
  this->promotions = 0;
LAB_001f7eae:
  while (-1 < res) {
    local_20 = Solver::priority(&this->super_Solver,res);
    while( true ) {
      bVar6 = false;
      if (-1 < res) {
        uVar9 = Solver::priority(&this->super_Solver,res);
        bVar6 = false;
        if (uVar9 == local_20) {
          bVar7 = bitset::operator[]((this->super_Solver).disabled,(long)res);
          bVar6 = true;
          if (!bVar7) {
            bVar6 = (int)local_20 < this->region[res];
          }
        }
      }
      if (!bVar6) break;
      res = res + -1;
    }
    if (res < 0) break;
    uVar9 = Solver::priority(&this->super_Solver,res);
    if (uVar9 == local_20) {
      this->inverse[(int)local_20] = res;
      bVar6 = setupRegion(this,res,local_20,true);
      if (bVar6) {
        while( true ) {
          if (1 < (this->super_Solver).trace) {
            reportRegion(this,local_20);
          }
          uVar9 = (*(this->super_Solver)._vptr_Solver[4])(this,(ulong)(uint)res,(ulong)local_20);
          if (uVar9 == 0xfffffffe) goto LAB_001f7fe0;
          if (uVar9 == 0xffffffff) break;
          promote(this,local_20,uVar9);
          res = this->inverse[(int)uVar9];
          local_20 = uVar9;
        }
        setDominion(this,local_20);
        lVar10 = Solver::nodecount(&this->super_Solver);
        res = (int)lVar10 + -1;
      }
      else {
        while( true ) {
          bVar6 = false;
          if (-1 < res) {
            uVar9 = Solver::priority(&this->super_Solver,res);
            bVar6 = uVar9 == local_20;
          }
          if (!bVar6) break;
          res = res + -1;
        }
      }
    }
    else {
      bVar6 = std::vector<int,_std::allocator<int>_>::empty(this->regions + (int)local_20);
      if (!bVar6) {
        resetRegion(this,local_20);
      }
    }
  }
  pvVar16 = this->regions;
  if (pvVar16 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar1 = pvVar16[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    this_00 = pvVar16 + (long)piVar1;
    while (pvVar16 != this_00) {
      this_00 = this_00 + -1;
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
    }
    operator_delete__(&pvVar16[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)piVar1 * 0x18 + 8);
  }
  if (this->region != (int *)0x0) {
    operator_delete__(this->region);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->inverse != (int *)0x0) {
    operator_delete__(this->inverse);
  }
  poVar15 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->promotions);
  poVar15 = std::operator<<(poVar15," promotions.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  return;
LAB_001f7fe0:
  while( true ) {
    bVar6 = false;
    if (-1 < res) {
      uVar9 = Solver::priority(&this->super_Solver,res);
      bVar6 = uVar9 == local_20;
    }
    if (!bVar6) break;
    res = res + -1;
  }
  goto LAB_001f7eae;
}

Assistant:

void
PPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // PP: always reset region
        if (setupRegion(i, p, true)) {
            // region not empty, maybe promote
            while (true) {
#ifndef NDEBUG
                if (trace >= 2) reportRegion(p);
#endif
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}